

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall DLevelScript::SetActorProperty(DLevelScript *this,int tid,int property,int value)

{
  AActor *pAVar1;
  FActorIterator iterator;
  FActorIterator local_30;
  
  if (tid != 0) {
    local_30.base = (AActor *)0x0;
    local_30.id = tid;
    while( true ) {
      pAVar1 = FActorIterator::Next(&local_30);
      if (pAVar1 == (AActor *)0x0) break;
      DoSetActorProperty(this,pAVar1,property,value);
    }
    return;
  }
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
  DoSetActorProperty(this,pAVar1,property,value);
  return;
}

Assistant:

void DLevelScript::SetActorProperty (int tid, int property, int value)
{
	if (tid == 0)
	{
		DoSetActorProperty (activator, property, value);
	}
	else
	{
		AActor *actor;
		FActorIterator iterator (tid);

		while ((actor = iterator.Next()) != NULL)
		{
			DoSetActorProperty (actor, property, value);
		}
	}
}